

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_table.c
# Opt level: O0

int int_table_check(ENGINE_TABLE **t,int create)

{
  lhash_st_ENGINE_PILE *plVar1;
  int in_ESI;
  long *in_RDI;
  lhash_st_ENGINE_PILE *lh;
  _func_int_ENGINE_PILE_ptr_ENGINE_PILE_ptr *in_stack_ffffffffffffffd8;
  _func_unsigned_long_ENGINE_PILE_ptr *in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*in_RDI == 0) {
    if (in_ESI == 0) {
      local_4 = 0;
    }
    else {
      plVar1 = lh_ENGINE_PILE_new(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (plVar1 == (lhash_st_ENGINE_PILE *)0x0) {
        local_4 = 0;
      }
      else {
        *in_RDI = (long)plVar1;
        local_4 = 1;
      }
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int int_table_check(ENGINE_TABLE **t, int create)
{
    LHASH_OF(ENGINE_PILE) *lh;

    if (*t)
        return 1;
    if (!create)
        return 0;
    if ((lh = lh_ENGINE_PILE_new(engine_pile_hash, engine_pile_cmp)) == NULL)
        return 0;
    *t = (ENGINE_TABLE *)lh;
    return 1;
}